

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O1

void __thiscall
vkt::QueryPool::anon_unknown_0::GeometryShaderTestInstance::draw
          (GeometryShaderTestInstance *this,VkCommandBuffer cmdBuffer)

{
  DeviceInterface *pDVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  
  pDVar1 = Context::getDeviceInterface
                     ((this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.
                      super_TestInstance.m_context);
  UNRECOVERED_JUMPTABLE = pDVar1->_vptr_DeviceInterface[0x59];
  if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology -
      VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST < 2) {
    (*UNRECOVERED_JUMPTABLE)(pDVar1,cmdBuffer,3,1,0,1);
    (*pDVar1->_vptr_DeviceInterface[0x59])(pDVar1,cmdBuffer,3,1,4,1);
    (*pDVar1->_vptr_DeviceInterface[0x59])(pDVar1,cmdBuffer,3,1,8,2);
    UNRECOVERED_JUMPTABLE = pDVar1->_vptr_DeviceInterface[0x59];
    uVar2 = 3;
    uVar3 = 0xc;
    uVar4 = 3;
  }
  else {
    uVar2 = 0x10;
    uVar3 = 0;
    uVar4 = 0;
  }
  (*UNRECOVERED_JUMPTABLE)(pDVar1,cmdBuffer,uVar2,1,uVar3,uVar4);
  return;
}

Assistant:

void GeometryShaderTestInstance::draw (VkCommandBuffer cmdBuffer)
{
	const DeviceInterface&	vk			= m_context.getDeviceInterface();
	if (m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP ||
		m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST)
	{
		vk.cmdDraw(cmdBuffer, 3u, 1u,  0u,  1u);
		vk.cmdDraw(cmdBuffer, 3u, 1u,  4u,  1u);
		vk.cmdDraw(cmdBuffer, 3u, 1u,  8u,  2u);
		vk.cmdDraw(cmdBuffer, 3u, 1u, 12u,  3u);
	}
	else
	{
		vk.cmdDraw(cmdBuffer, 16u, 1u, 0u,  0u);
	}
}